

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmSourceFileSetProperty(void *arg,char *prop,char *value)

{
  cmSourceFile *this;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  cmSourceFile *local_30;
  cmSourceFile *rsf;
  cmCPluginAPISourceFile *sf;
  char *value_local;
  char *prop_local;
  void *arg_local;
  
  this = *arg;
  local_30 = this;
  rsf = (cmSourceFile *)arg;
  sf = (cmCPluginAPISourceFile *)value;
  value_local = prop;
  prop_local = (char *)arg;
  if (this == (cmSourceFile *)0x0) {
    if (prop != (char *)0x0) {
      if (value == (char *)0x0) {
        sf = (cmCPluginAPISourceFile *)0xc50217;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,prop,&local_89);
      cmPropertyMap::SetProperty((cmPropertyMap *)((long)arg + 0x80),&local_88,(char *)sf);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,prop,&local_51);
    cmSourceFile::SetProperty(this,&local_50,(char *)sf);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return;
}

Assistant:

static void CCONV cmSourceFileSetProperty(void* arg, const char* prop,
                                          const char* value)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (cmSourceFile* rsf = sf->RealSourceFile) {
    rsf->SetProperty(prop, value);
  } else if (prop) {
    if (!value) {
      value = "NOTFOUND";
    }
    sf->Properties.SetProperty(prop, value);
  }
}